

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectMaterial(XFileParser *this,Material *pMaterial)

{
  size_type *psVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  Logger *this_00;
  ulong uVar5;
  ai_real aVar6;
  aiColor4D aVar7;
  string texname;
  string objectName;
  string matName;
  string local_228;
  string local_208;
  string local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  bool local_188;
  ios_base local_138 [264];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&local_1e8);
  if (local_1e8._M_string_length != 0) goto LAB_00635f86;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"material","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    uVar5 = CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,local_228.field_2._M_local_buf[0]
                    );
  }
  if (uVar5 < local_1c0 + local_228._M_string_length) {
    uVar5 = 0xf;
    if (local_1c8 != local_1b8) {
      uVar5 = local_1b8[0];
    }
    if (uVar5 < local_1c0 + local_228._M_string_length) goto LAB_00635ec0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
  }
  else {
LAB_00635ec0:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1c8);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_208.field_2._M_allocated_capacity = *psVar1;
    local_208.field_2._8_8_ = puVar4[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar1;
    local_208._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_208._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
LAB_00635f86:
  std::__cxx11::string::_M_assign((string *)pMaterial);
  pMaterial->mIsReference = false;
  aVar7 = ReadRGBA(this);
  pMaterial->mDiffuse = aVar7;
  aVar6 = ReadFloat(this);
  pMaterial->mSpecularExponent = aVar6;
  ReadRGB((XFileParser *)local_1a8);
  (pMaterial->mSpecular).r = (ai_real)local_1a8._0_4_;
  (pMaterial->mSpecular).g = (ai_real)local_1a8._4_4_;
  (pMaterial->mSpecular).b = (ai_real)local_1a8._8_4_;
  ReadRGB((XFileParser *)local_1a8);
  (pMaterial->mEmissive).r = (ai_real)local_1a8._0_4_;
  (pMaterial->mEmissive).g = (ai_real)local_1a8._4_4_;
  (pMaterial->mEmissive).b = (ai_real)local_1a8._8_4_;
  do {
    GetNextToken_abi_cxx11_(&local_208,this);
    if (local_208._M_string_length == 0) {
      local_1a8._0_8_ = &local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Unexpected end of file while parsing mesh material","");
      ThrowException(this,(string *)local_1a8);
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_208);
    if (iVar2 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_208);
      if (iVar3 == 0) {
LAB_006360de:
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        local_228._M_string_length = 0;
        local_228.field_2._M_local_buf[0] = '\0';
        ParseDataObjectTextureFilename(this,&local_228);
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,local_228._M_dataplus._M_p,
                   local_228._M_dataplus._M_p + local_228._M_string_length);
        local_188 = false;
        std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::
        emplace_back<Assimp::XFile::TexEntry>(&pMaterial->mTextures,(TexEntry *)local_1a8);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_208);
        if (iVar3 == 0) goto LAB_006360de;
        iVar3 = std::__cxx11::string::compare((char *)&local_208);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)&local_208);
          if (iVar3 != 0) {
            this_00 = DefaultLogger::get();
            Logger::warn(this_00,"Unknown data object in material in x file");
            ParseUnknownDataObject(this);
            goto LAB_006361d2;
          }
        }
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        local_228._M_string_length = 0;
        local_228.field_2._M_local_buf[0] = '\0';
        ParseDataObjectTextureFilename(this,&local_228);
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,local_228._M_dataplus._M_p,
                   local_228._M_dataplus._M_p + local_228._M_string_length);
        local_188 = true;
        std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::
        emplace_back<Assimp::XFile::TexEntry>(&pMaterial->mTextures,(TexEntry *)local_1a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
    }
LAB_006361d2:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectMaterial( Material* pMaterial)
{
    std::string matName;
    readHeadOfDataObject( &matName);
    if( matName.empty())
        matName = std::string( "material") + to_string( mLineNumber );
    pMaterial->mName = matName;
    pMaterial->mIsReference = false;

    // read material values
    pMaterial->mDiffuse = ReadRGBA();
    pMaterial->mSpecularExponent = ReadFloat();
    pMaterial->mSpecular = ReadRGB();
    pMaterial->mEmissive = ReadRGB();

    // read other data objects
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.size() == 0)
            ThrowException( "Unexpected end of file while parsing mesh material");
        else
        if( objectName == "}")
            break; // material finished
        else
        if( objectName == "TextureFilename" || objectName == "TextureFileName")
        {
            // some exporters write "TextureFileName" instead.
            std::string texname;
            ParseDataObjectTextureFilename( texname);
            pMaterial->mTextures.push_back( TexEntry( texname));
        } else
        if( objectName == "NormalmapFilename" || objectName == "NormalmapFileName")
        {
            // one exporter writes out the normal map in a separate filename tag
            std::string texname;
            ParseDataObjectTextureFilename( texname);
            pMaterial->mTextures.push_back( TexEntry( texname, true));
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in material in x file");
            ParseUnknownDataObject();
        }
    }
}